

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool __thiscall JetHead::Path::normalize(Path *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint local_58;
  uint local_54;
  uint i_1;
  uint i;
  bool start;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parts2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parts;
  Path *this_local;
  
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::vector
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&parts2.mSize);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::vector
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  split<std::__cxx11::string>
            (&this->mPath,"/",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&parts2.mSize);
  bVar2 = true;
  for (local_54 = 0;
      uVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&parts2.mSize), local_54 < uVar3; local_54 = local_54 + 1) {
    pbVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&parts2.mSize,local_54);
    bVar1 = std::operator==(pbVar4,"..");
    if (bVar1) {
      if (bVar2) {
        pbVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&parts2.mSize,local_54);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_40,pbVar4);
      }
      else {
        uVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40,uVar3 - 1);
      }
    }
    else {
      pbVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&parts2.mSize,local_54);
      bVar1 = std::operator!=(pbVar4,".");
      if (bVar1) {
        pbVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&parts2.mSize,local_54);
        bVar1 = std::operator!=(pbVar4,"");
        if (bVar1) {
          bVar2 = false;
          pbVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&parts2.mSize,local_54);
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_40,pbVar4);
        }
      }
    }
  }
  bVar2 = isRelative(this);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::assign((ulong)this,'\x01');
  }
  for (local_58 = 0;
      uVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_40), local_58 < uVar3 - 1; local_58 = local_58 + 1) {
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40,local_58);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::append((ulong)this,'\x01');
  }
  uVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,uVar3 - 1);
  std::__cxx11::string::append((string *)this);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~vector
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~vector
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&parts2.mSize);
  return true;
}

Assistant:

bool	Path::normalize()
{
	JetHead::vector<JHSTD::string> parts;
	JetHead::vector<JHSTD::string> parts2;
	JetHead::split( mPath, "/", parts );
	bool start = true;
	
	for ( unsigned i = 0; i < parts.size(); i++ )
	{
		if ( parts[ i ] == ".." )
		{
			if ( !start )
				parts2.erase( parts2.size() - 1	);
			else
				parts2.push_back( parts[ i ] );
		}
		else if ( parts[ i ] != "." && parts[ i ] != "" )
		{
			start = false;
			parts2.push_back( parts[ i ] );
		}
	}
		
	if ( isRelative() == false )
		mPath.assign( 1, PATH_SEPERATOR );
	else
		mPath.clear();
	
	for ( unsigned i = 0; i < parts2.size() - 1; i++ )
	{
		mPath.append( parts2[ i ] );
		mPath.append( 1, PATH_SEPERATOR );
	}

	mPath.append( parts2[ parts2.size() - 1 ] );
	
	return true;
}